

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XNA_Song.c
# Opt level: O0

float XNA_PlaySong(char *name)

{
  undefined2 uVar1;
  int iVar2;
  float fVar3;
  FAudioWaveFormatEx format;
  float in_stack_00000048;
  uint32_t in_stack_0000004c;
  FAudioWaveFormatEx *in_stack_00000050;
  FAudioSourceVoice **in_stack_00000058;
  FAudio *in_stack_00000060;
  FAudioEffectChain *in_stack_00000070;
  stb_vorbis_alloc *in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint uStack_30;
  undefined8 local_2c;
  undefined8 local_24;
  uint uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  
  XNA_SongKill();
  activeSong = stb_vorbis_open_filename
                         ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
  stb_vorbis_get_info((stb_vorbis_info *)&stack0xffffffffffffffcc,activeSong);
  activeSongInfo.channels = uStack_30;
  activeSongInfo.sample_rate = in_stack_ffffffffffffffcc;
  activeSongInfo._8_8_ = local_2c;
  activeSongInfo._16_8_ = local_24;
  uVar1 = (undefined2)uStack_30;
  uVar6 = 0x20;
  uVar4 = ((uStack_30 & 0xffff) * 0x20) / 8;
  uVar5 = (undefined2)uVar4;
  iVar2 = in_stack_ffffffffffffffcc * (uVar4 & 0xffff);
  uVar7 = 0;
  uVar4 = in_stack_ffffffffffffffcc;
  songCache = (uint8_t *)SDL_malloc(iVar2);
  SDL_memset(&callbacks,0,0x38);
  callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
  FAudio_CreateSourceVoice
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
             in_stack_00000048,(FAudioVoiceCallback *)name,(FAudioVoiceSends *)format._10_8_,
             in_stack_00000070);
  FAudioVoice_SetVolume
            ((FAudioVoice *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  stb_vorbis_seek_start((stb_vorbis *)0x13d37a);
  XNA_SongSubmitBuffer
            ((FAudioVoiceCallback *)
             CONCAT26(uVar7,CONCAT24(uVar6,CONCAT22(uVar5,(short)((uint)iVar2 >> 0x10)))),
             (void *)CONCAT26((short)iVar2,CONCAT42(uVar4,uVar1)));
  FAudioSourceVoice_Start
            ((FAudioSourceVoice *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (uint32_t)in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  fVar3 = stb_vorbis_stream_length_in_seconds((stb_vorbis *)0x13d3a2);
  return fVar3;
}

Assistant:

FAUDIOAPI float XNA_PlaySong(const char *name)
{
	FAudioWaveFormatEx format;
	XNA_SongKill();

	activeSong = stb_vorbis_open_filename(name, NULL, NULL);

	/* Set format info */
	activeSongInfo = stb_vorbis_get_info(activeSong);
	format.wFormatTag = FAUDIO_FORMAT_IEEE_FLOAT;
	format.nChannels = activeSongInfo.channels;
	format.nSamplesPerSec = activeSongInfo.sample_rate;
	format.wBitsPerSample = sizeof(float) * 8;
	format.nBlockAlign = format.nChannels * format.wBitsPerSample / 8;
	format.nAvgBytesPerSec = format.nSamplesPerSec * format.nBlockAlign;
	format.cbSize = 0;

	/* Allocate decode cache */
	songCache = (uint8_t*) FAudio_malloc(format.nAvgBytesPerSec);

	/* Init voice */
	FAudio_zero(&callbacks, sizeof(FAudioVoiceCallback));
	callbacks.OnBufferEnd = XNA_SongSubmitBuffer;
	FAudio_CreateSourceVoice(
		songAudio,
		&songVoice,
		&format,
		0,
		1.0f, /* No pitch shifting here! */
		&callbacks,
		NULL,
		NULL
	);
	FAudioVoice_SetVolume(songVoice, songVolume, 0);

	/* Okay, this song is decoding now */
	stb_vorbis_seek_start(activeSong);
	XNA_SongSubmitBuffer(NULL, NULL);

	/* Finally. */
	FAudioSourceVoice_Start(songVoice, 0, 0);
	return stb_vorbis_stream_length_in_seconds(activeSong);
}